

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

string * __thiscall
pbrt::MeasuredMaterial::ToString_abi_cxx11_(string *__return_storage_ptr__,MeasuredMaterial *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,"[ MeasuredMaterial displacement: %s ]",&this->displacement);
  return __return_storage_ptr__;
}

Assistant:

std::string MeasuredMaterial::ToString() const {
    return StringPrintf("[ MeasuredMaterial displacement: %s ]", displacement);
}